

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

VertexFacetType ON_SubD::VertexFacetTypeFromUnsigned(uint vertex_facet_type_as_unsigned)

{
  undefined1 local_9;
  uint vertex_facet_type_as_unsigned_local;
  
  if (vertex_facet_type_as_unsigned == 0) {
    local_9 = Unset;
  }
  else if (vertex_facet_type_as_unsigned == 3) {
    local_9 = Tri;
  }
  else if (vertex_facet_type_as_unsigned == 4) {
    local_9 = Quad;
  }
  else if (vertex_facet_type_as_unsigned == 5) {
    local_9 = Ngon;
  }
  else if (vertex_facet_type_as_unsigned == 0xff) {
    local_9 = Mixed;
  }
  else {
    ON_SubDIncrementErrorCount();
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_SubD::VertexFacetType ON_SubD::VertexFacetTypeFromUnsigned(
  unsigned int vertex_facet_type_as_unsigned
  )
{
  switch (vertex_facet_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Tri);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Quad);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Ngon);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubD::VertexFacetType::Mixed);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubD::VertexFacetType::Unset);
}